

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::RunContext::invokeTestCase(TestCase *testCase)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    signal(*(int *)((long)&signalDefs + lVar1),FatalConditionHandler::handleSignal);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x60);
  (*(((testCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  lVar1 = 0;
  do {
    signal(*(int *)((long)&signalDefs + lVar1),(__sighandler_t)0x0);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x60);
  return;
}

Assistant:

static void invokeTestCase( TestCase const& testCase ) {
            FatalConditionHandler fatalConditionHandler; // Handle signals
            testCase.invoke();
            fatalConditionHandler.reset(); // Not strictly needed but avoids warnings
        }